

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void jinit_upsampler(j_decompress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  jpeg_upsampler *pjVar7;
  long lVar8;
  JSAMPARRAY ppJVar9;
  int v_out_group;
  int h_out_group;
  int v_in_group;
  int h_in_group;
  boolean need_buffer;
  jpeg_component_info *compptr;
  int ci;
  my_upsample_ptr_conflict upsample;
  j_decompress_ptr cinfo_local;
  
  pjVar7 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
  cinfo->upsample = pjVar7;
  pjVar7->start_pass = start_pass_upsample;
  pjVar7->upsample = sep_upsample;
  pjVar7->need_context_rows = 0;
  if (cinfo->CCIR601_sampling != 0) {
    cinfo->err->msg_code = 0x1a;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  compptr._4_4_ = 0;
  _h_in_group = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar5 = (_h_in_group->h_samp_factor * _h_in_group->DCT_h_scaled_size) /
            cinfo->min_DCT_h_scaled_size;
    iVar6 = (_h_in_group->v_samp_factor * _h_in_group->DCT_v_scaled_size) /
            cinfo->min_DCT_v_scaled_size;
    iVar1 = cinfo->max_h_samp_factor;
    iVar2 = cinfo->max_v_samp_factor;
    *(int *)((long)&pjVar7[8].start_pass + (long)compptr._4_4_ * 4) = iVar6;
    bVar4 = true;
    if (_h_in_group->component_needed == 0) {
      (&pjVar7[4].upsample)[compptr._4_4_] = noop_upsample;
      bVar4 = false;
    }
    else if ((iVar5 == iVar1) && (iVar6 == iVar2)) {
      (&pjVar7[4].upsample)[compptr._4_4_] = fullsize_upsample;
      bVar4 = false;
    }
    else if ((iVar5 << 1 == iVar1) && (iVar6 == iVar2)) {
      (&pjVar7[4].upsample)[compptr._4_4_] = h2v1_upsample;
    }
    else if ((iVar5 << 1 == iVar1) && (iVar6 << 1 == iVar2)) {
      (&pjVar7[4].upsample)[compptr._4_4_] = h2v2_upsample;
    }
    else if ((iVar1 % iVar5 == 0) && (iVar2 % iVar6 == 0)) {
      (&pjVar7[4].upsample)[compptr._4_4_] = int_upsample;
      *(char *)((long)&pjVar7[9].need_context_rows + (long)compptr._4_4_) = (char)(iVar1 / iVar5);
      *(char *)((long)&pjVar7[10].start_pass + (long)compptr._4_4_ + 2) = (char)(iVar2 / iVar6);
    }
    else {
      cinfo->err->msg_code = 0x27;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (bVar4) {
      p_Var3 = cinfo->mem->alloc_sarray;
      lVar8 = jround_up((ulong)cinfo->output_width,(long)cinfo->max_h_samp_factor);
      ppJVar9 = (*p_Var3)((j_common_ptr)cinfo,1,(JDIMENSION)lVar8,cinfo->max_v_samp_factor);
      (&pjVar7[1].start_pass)[compptr._4_4_] = (_func_void_j_decompress_ptr *)ppJVar9;
    }
    _h_in_group = _h_in_group + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_upsampler (j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;
  int ci;
  jpeg_component_info * compptr;
  boolean need_buffer;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  upsample = (my_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *) upsample;
  upsample->pub.start_pass = start_pass_upsample;
  upsample->pub.upsample = sep_upsample;
  upsample->pub.need_context_rows = FALSE; /* until we find out differently */

  if (cinfo->CCIR601_sampling)	/* this isn't supported */
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, select per-component methods,
   * and create storage as needed.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "input group" after IDCT scaling.  This many samples
     * are to be converted to max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_in_group = (compptr->h_samp_factor * compptr->DCT_h_scaled_size) /
		 cinfo->min_DCT_h_scaled_size;
    v_in_group = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		 cinfo->min_DCT_v_scaled_size;
    h_out_group = cinfo->max_h_samp_factor;
    v_out_group = cinfo->max_v_samp_factor;
    upsample->rowgroup_height[ci] = v_in_group; /* save for use later */
    need_buffer = TRUE;
    if (! compptr->component_needed) {
      /* Don't bother to upsample an uninteresting component. */
      upsample->methods[ci] = noop_upsample;
      need_buffer = FALSE;
    } else if (h_in_group == h_out_group && v_in_group == v_out_group) {
      /* Fullsize components can be processed without any work. */
      upsample->methods[ci] = fullsize_upsample;
      need_buffer = FALSE;
    } else if (h_in_group * 2 == h_out_group &&
	       v_in_group == v_out_group) {
      /* Special case for 2h1v upsampling */
      upsample->methods[ci] = h2v1_upsample;
    } else if (h_in_group * 2 == h_out_group &&
	       v_in_group * 2 == v_out_group) {
      /* Special case for 2h2v upsampling */
      upsample->methods[ci] = h2v2_upsample;
    } else if ((h_out_group % h_in_group) == 0 &&
	       (v_out_group % v_in_group) == 0) {
      /* Generic integral-factors upsampling method */
      upsample->methods[ci] = int_upsample;
      upsample->h_expand[ci] = (UINT8) (h_out_group / h_in_group);
      upsample->v_expand[ci] = (UINT8) (v_out_group / v_in_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
    if (need_buffer) {
      upsample->color_buf[ci] = (*cinfo->mem->alloc_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE,
	 (JDIMENSION) jround_up((long) cinfo->output_width,
				(long) cinfo->max_h_samp_factor),
	 (JDIMENSION) cinfo->max_v_samp_factor);
    }
  }
}